

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CropResizeLayerParams::SerializeWithCachedSizes
          (CropResizeLayerParams *this,CodedOutputStream *output)

{
  float value;
  uint64 value_00;
  int index;
  int iVar1;
  
  iVar1 = (this->targetsize_).current_size_;
  if (0 < iVar1) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_targetsize_cached_byte_size_);
    iVar1 = (this->targetsize_).current_size_;
  }
  index = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
    index = 0;
  }
  for (; iVar1 != index; index = index + 1) {
    value_00 = targetsize(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value_00);
  }
  if (this->normalizedcoordinates_ != false) {
    google::protobuf::internal::WireFormatLite::WriteBool(2,true,output);
  }
  if (this->mode_ != (SamplingMode *)0x0 &&
      this != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->mode_->super_MessageLite,output);
  }
  if (this->boxindicesmode_ != (BoxCoordinatesMode *)0x0 &&
      this != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&this->boxindicesmode_->super_MessageLite,output);
  }
  value = this->spatialscale_;
  if ((value == 0.0) && (!NAN(value))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteFloat(5,value,output);
  return;
}

Assistant:

void CropResizeLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CropResizeLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 targetSize = 1;
  if (this->targetsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_targetsize_cached_byte_size_);
  }
  for (int i = 0, n = this->targetsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->targetsize(i), output);
  }

  // bool normalizedCoordinates = 2;
  if (this->normalizedcoordinates() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->normalizedcoordinates(), output);
  }

  // .CoreML.Specification.SamplingMode mode = 3;
  if (this->has_mode()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->mode_, output);
  }

  // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
  if (this->has_boxindicesmode()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *this->boxindicesmode_, output);
  }

  // float spatialScale = 5;
  if (this->spatialscale() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(5, this->spatialscale(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CropResizeLayerParams)
}